

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char local_21;
  vector_<char> arr;
  
  vector_<char>::vector_(&arr);
  local_21 = 'w';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 's';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'i';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'm';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'a';
  vector_<char>::insert(&arr,1,&local_21);
  local_21 = 'a';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'k';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'r';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'a';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'm';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'k';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'h';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'a';
  vector_<char>::push_back(&arr,&local_21);
  local_21 = 'n';
  vector_<char>::push_back(&arr,&local_21);
  poVar1 = operator<<((ostream *)&std::cout,&arr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  vector_<char>::clear(&arr);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&arr.arr);
  return 0;
}

Assistant:

int main() {
    vector_<char> arr;
    arr.push_back('w');
    arr.push_back('s');
    arr.push_back('i');
    arr.push_back('m');
    arr.insert(1, 'a');
    arr.push_back('a');
    arr.push_back('k');
    arr.push_back('r');
    arr.push_back('a');
    arr.push_back('m');
    arr.push_back('k');
    arr.push_back('h');
    arr.push_back('a');
    arr.push_back('n');
    cout << arr << endl;
    cout << sizeof(arr) << endl;
    arr.clear();
}